

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

Node * __thiscall Parser::test(Node *__return_storage_ptr__,Parser *this)

{
  vector<Node,_std::allocator<Node>_> *pvVar1;
  lexemtype lVar2;
  Node thisNode;
  string local_1c8;
  Node local_1a8;
  Node local_168;
  Node local_128;
  Node local_e8;
  Node local_a8;
  Node local_68;
  
  sum(__return_storage_ptr__,this);
  lVar2 = (this->lexer).lexem.type;
  if (lVar2 == MORE) {
    Lexer::nextLexem(&this->lexer,&this->fin);
    Node::Node(&local_168,__return_storage_ptr__);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    Node::Node(&local_1a8,COMPR,&local_1c8);
    __return_storage_ptr__->_if = local_1a8._if;
    __return_storage_ptr__->_else = local_1a8._else;
    __return_storage_ptr__->kind = local_1a8.kind;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value);
    pvVar1 = &__return_storage_ptr__->subnodes;
    std::vector<Node,_std::allocator<Node>_>::operator=(pvVar1,&local_1a8.subnodes);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_1a8.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.value._M_dataplus._M_p != &local_1a8.value.field_2) {
      operator_delete(local_1a8.value._M_dataplus._M_p,
                      local_1a8.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    Node::Node(&local_e8,&local_168);
    std::vector<Node,_std::allocator<Node>_>::push_back(pvVar1,&local_e8);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_e8.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8.value._M_dataplus._M_p != &local_e8.value.field_2) {
      operator_delete(local_e8.value._M_dataplus._M_p,
                      local_e8.value.field_2._M_allocated_capacity + 1);
    }
    sum(&local_128,this);
    std::vector<Node,_std::allocator<Node>_>::push_back(pvVar1,&local_128);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_128.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.value._M_dataplus._M_p == &local_128.value.field_2) goto LAB_00108469;
  }
  else {
    if (lVar2 != LESS) {
      return __return_storage_ptr__;
    }
    Lexer::nextLexem(&this->lexer,&this->fin);
    Node::Node(&local_168,__return_storage_ptr__);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
    Node::Node(&local_1a8,COMPL,&local_1c8);
    __return_storage_ptr__->_if = local_1a8._if;
    __return_storage_ptr__->_else = local_1a8._else;
    __return_storage_ptr__->kind = local_1a8.kind;
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->value);
    pvVar1 = &__return_storage_ptr__->subnodes;
    std::vector<Node,_std::allocator<Node>_>::operator=(pvVar1,&local_1a8.subnodes);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_1a8.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.value._M_dataplus._M_p != &local_1a8.value.field_2) {
      operator_delete(local_1a8.value._M_dataplus._M_p,
                      local_1a8.value.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    Node::Node(&local_68,&local_168);
    std::vector<Node,_std::allocator<Node>_>::push_back(pvVar1,&local_68);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_68.subnodes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.value._M_dataplus._M_p != &local_68.value.field_2) {
      operator_delete(local_68.value._M_dataplus._M_p,
                      local_68.value.field_2._M_allocated_capacity + 1);
    }
    sum(&local_a8,this);
    std::vector<Node,_std::allocator<Node>_>::push_back(pvVar1,&local_a8);
    std::vector<Node,_std::allocator<Node>_>::~vector(&local_a8.subnodes);
    local_128.value.field_2._M_allocated_capacity = local_a8.value.field_2._M_allocated_capacity;
    local_128.value._M_dataplus._M_p = local_a8.value._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.value._M_dataplus._M_p == &local_a8.value.field_2) goto LAB_00108469;
  }
  operator_delete(local_128.value._M_dataplus._M_p,local_128.value.field_2._M_allocated_capacity + 1
                 );
LAB_00108469:
  std::vector<Node,_std::allocator<Node>_>::~vector(&local_168.subnodes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.value._M_dataplus._M_p != &local_168.value.field_2) {
    operator_delete(local_168.value._M_dataplus._M_p,
                    local_168.value.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Node Parser::test() { // todo make "compare" with operator
    Node testNode = sum();
    if (getLexemType() == LESS) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPL);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    } else if (getLexemType() == MORE) {
        nextLexem();
        Node thisNode = Node(testNode);
        testNode = Node(COMPR);
        testNode.addSubnode(thisNode);
        testNode.addSubnode(sum());
    }
    return testNode;
}